

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::FixedSizeFetchRow<short>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  shared_ptr<duckdb::BlockHandle,_true> *psVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  BufferHandle *this;
  unsigned_long uVar4;
  ColumnSegment *in_RDI;
  long in_R8;
  data_ptr_t data_ptr;
  BufferHandle handle;
  BufferManager *buffer_manager;
  undefined1 local_48 [24];
  BufferManager *local_30;
  long local_28;
  ColumnSegment *local_8;
  
  local_28 = in_R8;
  local_8 = in_RDI;
  local_30 = BufferManager::GetBufferManager((DatabaseInstance *)0xa3ea24);
  (*local_30->_vptr_BufferManager[7])(local_48,local_30,&local_8->block);
  pdVar2 = BufferHandle::Ptr((BufferHandle *)0xa3ea5a);
  iVar3 = ColumnSegment::GetBlockOffset(local_8);
  this = (BufferHandle *)(pdVar2 + iVar3);
  uVar4 = NumericCast<unsigned_long,long,void>(0xa3ea88);
  psVar1 = &this->handle;
  pdVar2 = FlatVector::GetData((Vector *)0xa3eaae);
  *(undefined2 *)(pdVar2 + local_28 * 2) =
       *(undefined2 *)
        ((long)&(psVar1->internal).
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        uVar4 * 2);
  BufferHandle::~BufferHandle(this);
  return;
}

Assistant:

void FixedSizeFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                       idx_t result_idx) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);

	// first fetch the data from the base table
	auto data_ptr = handle.Ptr() + segment.GetBlockOffset() + NumericCast<idx_t>(row_id) * sizeof(T);

	memcpy(FlatVector::GetData(result) + result_idx * sizeof(T), data_ptr, sizeof(T));
}